

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void embree::SceneGraph::resize_randomly
               (RandomSampler *sampler,Ref<embree::SceneGraph::Node> *node,size_t N)

{
  Triangle *__args;
  Hair *__args_00;
  undefined4 uVar1;
  Node *pNVar2;
  long lVar3;
  iterator __position;
  undefined8 uVar4;
  iterator __position_00;
  iterator __position_01;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long *plVar10;
  long *plVar11;
  long *plVar12;
  long *plVar13;
  long *plVar14;
  long *plVar15;
  long *plVar16;
  Quad *__args_01;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  size_t sVar22;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  if (node->ptr == (Node *)0x0) {
    plVar10 = (long *)0x0;
  }
  else {
    plVar10 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (plVar10 != (long *)0x0) {
    (**(code **)(*plVar10 + 0x10))(plVar10);
    pNVar2 = (Node *)plVar10[0x13];
    local_38.ptr = pNVar2;
    if (pNVar2 != (Node *)0x0) {
      (*(pNVar2->super_RefCount)._vptr_RefCount[2])(pNVar2);
    }
    resize_randomly(sampler,&local_38,N);
    if (pNVar2 != (Node *)0x0) {
      (*(pNVar2->super_RefCount)._vptr_RefCount[3])(pNVar2);
    }
    goto LAB_0014eec8;
  }
  if (node->ptr == (Node *)0x0) {
    plVar11 = (long *)0x0;
  }
  else {
    plVar11 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&GroupNode::typeinfo,0);
  }
  if (plVar11 == (long *)0x0) {
    if (node->ptr == (Node *)0x0) {
      plVar12 = (long *)0x0;
    }
    else {
      plVar12 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
    }
    if (plVar12 == (long *)0x0) {
      if (node->ptr == (Node *)0x0) {
        plVar13 = (long *)0x0;
      }
      else {
        plVar13 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
      }
      if (plVar13 == (long *)0x0) {
        if (node->ptr == (Node *)0x0) {
          plVar14 = (long *)0x0;
        }
        else {
          plVar14 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&HairSetNode::typeinfo,0);
        }
        if (plVar14 == (long *)0x0) {
          if (node->ptr == (Node *)0x0) {
            plVar15 = (long *)0x0;
          }
          else {
            plVar15 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&PointSetNode::typeinfo,0);
          }
          if (plVar15 == (long *)0x0) {
            if (node->ptr == (Node *)0x0) {
              plVar16 = (long *)0x0;
            }
            else {
              plVar16 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&SubdivMeshNode::typeinfo,0
                                              );
            }
            if (plVar16 != (long *)0x0) {
              (**(code **)(*plVar16 + 0x10))(plVar16);
              if ((ulong)(plVar16[0x23] - plVar16[0x22] >> 2) <= N) {
                (**(code **)(*plVar16 + 0x18))(plVar16);
                goto LAB_0014eeef;
              }
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(plVar16 + 0x22),N);
            }
            if (plVar16 != (long *)0x0) {
              (**(code **)(*plVar16 + 0x18))(plVar16);
            }
          }
          else {
            (**(code **)(*plVar15 + 0x10))(plVar15);
            if ((ulong)(plVar15[0x10] - plVar15[0xf] >> 5) <= N) {
LAB_0014eeef:
              if (plVar15 != (long *)0x0) {
                (**(code **)(*plVar15 + 0x18))(plVar15);
              }
              goto LAB_0014ef03;
            }
            std::
            vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      *)(plVar15 + 0xf),N);
          }
          if (plVar15 != (long *)0x0) {
            (**(code **)(*plVar15 + 0x18))(plVar15);
          }
        }
        else {
          (**(code **)(*plVar14 + 0x10))(plVar14);
          if (plVar14[0x1c] == plVar14[0x1b]) {
LAB_0014ef03:
            if (plVar14 != (long *)0x0) {
              (**(code **)(*plVar14 + 0x18))(plVar14);
            }
            goto LAB_0014ef16;
          }
          if (N != 0) {
            uVar19 = 0;
            do {
              uVar9 = sampler->s * 0x19660d + 0x3c6ef35f;
              sampler->s = uVar9;
              lVar20 = plVar14[0x1b];
              __position_01._M_current = (Hair *)plVar14[0x1c];
              uVar21 = (long)__position_01._M_current - lVar20 >> 3;
              sVar22 = N;
              if (uVar21 < N) {
                sVar22 = uVar21;
              }
              uVar17 = (ulong)(uVar9 >> 1) % sVar22;
              if (uVar19 < uVar21) {
                uVar4 = *(undefined8 *)(lVar20 + uVar19 * 8);
                *(undefined8 *)(lVar20 + uVar19 * 8) = *(undefined8 *)(lVar20 + uVar17 * 8);
                *(undefined8 *)(lVar20 + uVar17 * 8) = uVar4;
              }
              else {
                __args_00 = (Hair *)(lVar20 + uVar17 * 8);
                if (__position_01._M_current == (Hair *)plVar14[0x1d]) {
                  std::
                  vector<embree::SceneGraph::HairSetNode::Hair,std::allocator<embree::SceneGraph::HairSetNode::Hair>>
                  ::_M_realloc_insert<embree::SceneGraph::HairSetNode::Hair_const&>
                            ((vector<embree::SceneGraph::HairSetNode::Hair,std::allocator<embree::SceneGraph::HairSetNode::Hair>>
                              *)(plVar14 + 0x1b),__position_01,__args_00);
                }
                else {
                  *__position_01._M_current = *__args_00;
                  plVar14[0x1c] = plVar14[0x1c] + 8;
                }
              }
              uVar19 = uVar19 + 1;
            } while (N != uVar19);
          }
        }
        if (plVar14 != (long *)0x0) {
          (**(code **)(*plVar14 + 0x18))();
        }
      }
      else {
        (**(code **)(*plVar13 + 0x10))(plVar13);
        if (plVar13[0x18] == plVar13[0x17]) {
LAB_0014ef16:
          if (plVar13 != (long *)0x0) {
            (**(code **)(*plVar13 + 0x18))(plVar13);
          }
          goto LAB_0014ef25;
        }
        if (N != 0) {
          lVar20 = 0;
          uVar19 = 0;
          do {
            uVar9 = sampler->s * 0x19660d + 0x3c6ef35f;
            sampler->s = uVar9;
            lVar3 = plVar13[0x17];
            __position_00._M_current = (Quad *)plVar13[0x18];
            uVar21 = (long)__position_00._M_current - lVar3 >> 4;
            sVar22 = N;
            if (uVar21 < N) {
              sVar22 = uVar21;
            }
            lVar18 = ((ulong)(uVar9 >> 1) % sVar22) * 0x10;
            if (uVar19 < uVar21) {
              uVar4 = *(undefined8 *)(lVar3 + lVar20);
              uVar5 = ((undefined8 *)(lVar3 + lVar20))[1];
              uVar6 = ((undefined8 *)(lVar3 + lVar18))[1];
              *(undefined8 *)(lVar3 + lVar20) = *(undefined8 *)(lVar3 + lVar18);
              ((undefined8 *)(lVar3 + lVar20))[1] = uVar6;
              *(undefined8 *)(lVar3 + lVar18) = uVar4;
              ((undefined8 *)(lVar3 + lVar18))[1] = uVar5;
            }
            else {
              __args_01 = (Quad *)(lVar3 + lVar18);
              if (__position_00._M_current == (Quad *)plVar13[0x19]) {
                std::
                vector<embree::SceneGraph::QuadMeshNode::Quad,std::allocator<embree::SceneGraph::QuadMeshNode::Quad>>
                ::_M_realloc_insert<embree::SceneGraph::QuadMeshNode::Quad_const&>
                          ((vector<embree::SceneGraph::QuadMeshNode::Quad,std::allocator<embree::SceneGraph::QuadMeshNode::Quad>>
                            *)(plVar13 + 0x17),__position_00,__args_01);
              }
              else {
                uVar9 = __args_01->v1;
                uVar7 = __args_01->v2;
                uVar8 = __args_01->v3;
                (__position_00._M_current)->v0 = __args_01->v0;
                (__position_00._M_current)->v1 = uVar9;
                (__position_00._M_current)->v2 = uVar7;
                (__position_00._M_current)->v3 = uVar8;
                plVar13[0x18] = plVar13[0x18] + 0x10;
              }
            }
            uVar19 = uVar19 + 1;
            lVar20 = lVar20 + 0x10;
          } while (N != uVar19);
        }
      }
      if (plVar13 != (long *)0x0) {
        (**(code **)(*plVar13 + 0x18))();
      }
    }
    else {
      (**(code **)(*plVar12 + 0x10))(plVar12);
      if (plVar12[0x18] == plVar12[0x17]) {
LAB_0014ef25:
        if (plVar12 != (long *)0x0) {
          (**(code **)(*plVar12 + 0x18))();
        }
        goto LAB_0014eec8;
      }
      if (N != 0) {
        lVar20 = 0;
        uVar19 = 0;
        do {
          uVar9 = sampler->s * 0x19660d + 0x3c6ef35f;
          sampler->s = uVar9;
          lVar3 = plVar12[0x17];
          __position._M_current = (Triangle *)plVar12[0x18];
          uVar21 = ((long)__position._M_current - lVar3 >> 2) * -0x5555555555555555;
          sVar22 = N;
          if (uVar21 < N) {
            sVar22 = uVar21;
          }
          uVar17 = (ulong)(uVar9 >> 1) % sVar22;
          if (uVar19 < uVar21) {
            uVar1 = *(undefined4 *)(lVar3 + 8 + lVar20);
            uVar4 = *(undefined8 *)(lVar3 + lVar20);
            *(undefined4 *)(lVar3 + 8 + lVar20) = *(undefined4 *)(lVar3 + 8 + uVar17 * 0xc);
            *(undefined8 *)(lVar3 + lVar20) = *(undefined8 *)(lVar3 + uVar17 * 0xc);
            *(undefined4 *)(lVar3 + 8 + uVar17 * 0xc) = uVar1;
            *(undefined8 *)(lVar3 + uVar17 * 0xc) = uVar4;
          }
          else {
            __args = (Triangle *)(lVar3 + uVar17 * 0xc);
            if (__position._M_current == (Triangle *)plVar12[0x19]) {
              std::
              vector<embree::SceneGraph::TriangleMeshNode::Triangle,std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>>
              ::_M_realloc_insert<embree::SceneGraph::TriangleMeshNode::Triangle_const&>
                        ((vector<embree::SceneGraph::TriangleMeshNode::Triangle,std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>>
                          *)(plVar12 + 0x17),__position,__args);
            }
            else {
              (__position._M_current)->v2 = __args->v2;
              uVar9 = __args->v1;
              (__position._M_current)->v0 = __args->v0;
              (__position._M_current)->v1 = uVar9;
              plVar12[0x18] = plVar12[0x18] + 0xc;
            }
          }
          uVar19 = uVar19 + 1;
          lVar20 = lVar20 + 0xc;
        } while (N != uVar19);
      }
    }
    if (plVar12 != (long *)0x0) {
      (**(code **)(*plVar12 + 0x18))(plVar12);
    }
  }
  else {
    (**(code **)(*plVar11 + 0x10))(plVar11);
    lVar20 = plVar11[0xd];
    if (plVar11[0xe] != lVar20) {
      uVar19 = 0;
      do {
        pNVar2 = *(Node **)(lVar20 + uVar19 * 8);
        local_40.ptr = pNVar2;
        if (pNVar2 != (Node *)0x0) {
          (*(pNVar2->super_RefCount)._vptr_RefCount[2])(pNVar2);
        }
        resize_randomly(sampler,&local_40,N);
        if (pNVar2 != (Node *)0x0) {
          (*(pNVar2->super_RefCount)._vptr_RefCount[3])(pNVar2);
        }
        uVar19 = uVar19 + 1;
        lVar20 = plVar11[0xd];
      } while (uVar19 < (ulong)(plVar11[0xe] - lVar20 >> 3));
    }
  }
  if (plVar11 != (long *)0x0) {
    (**(code **)(*plVar11 + 0x18))(plVar11);
  }
LAB_0014eec8:
  if (plVar10 != (long *)0x0) {
    (**(code **)(*plVar10 + 0x18))(plVar10);
  }
  return;
}

Assistant:

void SceneGraph::resize_randomly(RandomSampler& sampler, Ref<Node> node, const size_t N)
  {
     if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
       resize_randomly(sampler,xfmNode->child, N);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        resize_randomly(sampler,groupNode->children[i],N);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) 
    {
      if (!mesh->triangles.size()) return;
      for (size_t i=0; i<N; i++) {
        size_t j = RandomSampler_getInt(sampler)%(min(mesh->triangles.size(),N));
        if (i < mesh->triangles.size()) std::swap(mesh->triangles[i],mesh->triangles[j]);
        else                            mesh->triangles.push_back(mesh->triangles[j]);
      }
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) 
    {
      if (!mesh->quads.size()) return;
      for (size_t i=0; i<N; i++) {
        size_t j = RandomSampler_getInt(sampler)%(min(mesh->quads.size(),N));
        if (i < mesh->quads.size()) std::swap(mesh->quads[i],mesh->quads[j]);
        else                        mesh->quads.push_back(mesh->quads[j]);
      }
    }
    else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      if (!mesh->hairs.size()) return;
      for (size_t i=0; i<N; i++) {
        size_t j = RandomSampler_getInt(sampler)%(min(mesh->hairs.size(),N));
        if (i < mesh->hairs.size()) std::swap(mesh->hairs[i],mesh->hairs[j]);
        else                        mesh->hairs.push_back(mesh->hairs[j]);
      }
    }
    else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>())
    {
      if (mesh->positions.size() <= N) return;
      mesh->positions.resize(N);
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>())
    {
      if (mesh->verticesPerFace.size() <= N) return;
      mesh->verticesPerFace.resize(N);
    }
  }